

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O3

int vrna_nucleotide_IUPAC_identity(char nt,char mask)

{
  __int32_t **pp_Var1;
  char cVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  size_t __n;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  char *pcVar6;
  
  pp_Var1 = __ctype_toupper_loc();
  iVar4 = (int)(char)(*pp_Var1)[(int)CONCAT71(in_register_00000039,nt)];
  pcVar6 = (char *)0x0;
  if (0x18 < iVar4 - 0x41U) goto switchD_0012a682_caseD_45;
  uVar5 = (*pp_Var1)[(int)CONCAT71(in_register_00000031,mask)];
  cVar2 = (char)uVar5;
  switch(iVar4) {
  case 0x41:
    pcVar6 = "ARMWDHVN";
    break;
  case 0x42:
    pcVar6 = "GCTBU";
    goto LAB_0012a6f4;
  case 0x43:
    pcVar6 = "CYMSBHVN";
    break;
  case 0x44:
    pcVar6 = "AGTUD";
    goto LAB_0012a6f4;
  default:
    goto switchD_0012a682_caseD_45;
  case 0x47:
    pcVar6 = "GRKSBDVN";
    break;
  case 0x48:
    pcVar6 = "ACTUH";
LAB_0012a6f4:
    __n = 6;
    goto LAB_0012a78b;
  case 0x49:
    if (cVar2 == '\0') {
      lVar3 = 2;
    }
    else {
      uVar5 = uVar5 & 0xff;
      lVar3 = 0;
      if (uVar5 != 0x49) {
        pcVar6 = (char *)0x0;
        if (uVar5 != 0x4e) goto switchD_0012a682_caseD_45;
        lVar3 = 1;
      }
    }
    pcVar6 = "IN" + lVar3;
    goto switchD_0012a682_caseD_45;
  case 0x4b:
    pcVar6 = "GTUK";
    goto LAB_0012a786;
  case 0x4d:
    pcVar6 = "ACM";
    goto LAB_0012a775;
  case 0x4e:
    pcVar6 = "ACGTUN";
    __n = 7;
    goto LAB_0012a78b;
  case 0x52:
    pcVar6 = "AGR";
    goto LAB_0012a775;
  case 0x53:
    pcVar6 = "GCS";
LAB_0012a775:
    __n = 4;
    goto LAB_0012a78b;
  case 0x54:
    pcVar6 = "TYKWBDHN";
    break;
  case 0x55:
    pcVar6 = "UYKWBDHN";
    break;
  case 0x56:
    pcVar6 = "ACGV";
    goto LAB_0012a786;
  case 0x57:
    pcVar6 = "ATUW";
    goto LAB_0012a786;
  case 0x59:
    pcVar6 = "CTUY";
LAB_0012a786:
    __n = 5;
    goto LAB_0012a78b;
  }
  __n = 9;
LAB_0012a78b:
  pcVar6 = (char *)memchr(pcVar6,(int)cVar2,__n);
switchD_0012a682_caseD_45:
  return (int)(pcVar6 != (char *)0x0);
}

Assistant:

PUBLIC int
vrna_nucleotide_IUPAC_identity(char nt,
                               char mask)
{
  char n1, n2, *p;

  p   = NULL;
  n1  = toupper(nt);
  n2  = toupper(mask);

  switch (n1) {
    case 'A':
      p = strchr("ARMWDHVN", n2);
      break;
    case 'C':
      p = strchr("CYMSBHVN", n2);
      break;
    case 'G':
      p = strchr("GRKSBDVN", n2);
      break;
    case 'T':
      p = strchr("TYKWBDHN", n2);
      break;
    case 'U':
      p = strchr("UYKWBDHN", n2);
      break;
    case 'I':
      p = strchr("IN", n2);
      break;
    case 'R':
      p = strchr("AGR", n2);
      break;
    case 'Y':
      p = strchr("CTUY", n2);
      break;
    case 'K':
      p = strchr("GTUK", n2);
      break;
    case 'M':
      p = strchr("ACM", n2);
      break;
    case 'S':
      p = strchr("GCS", n2);
      break;
    case 'W':
      p = strchr("ATUW", n2);
      break;
    case 'B':
      p = strchr("GCTBU", n2);
      break;
    case 'D':
      p = strchr("AGTUD", n2);
      break;
    case 'H':
      p = strchr("ACTUH", n2);
      break;
    case 'V':
      p = strchr("ACGV", n2);
      break;
    case 'N':
      p = strchr("ACGTUN", n2);
      break;
  }

  return (p) ? 1 : 0;
}